

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall embree::Camera::move(Camera *this,float dx,float dy,float dz)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  Vec3fa ds;
  AffineSpace3fa xfm;
  undefined8 local_4d8;
  undefined8 uStackY_4d0;
  Camera *in_stack_fffffffffffffb40;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  camera2world(in_stack_fffffffffffffb40);
  local_1a8 = (float)local_4d8;
  fStack_1a4 = (float)((ulong)local_4d8 >> 0x20);
  fStack_1a0 = (float)uStackY_4d0;
  fStack_19c = (float)((ulong)uStackY_4d0 >> 0x20);
  local_68 = (float)local_328;
  fStack_64 = (float)((ulong)local_328 >> 0x20);
  fStack_60 = (float)uStack_320;
  fStack_5c = (float)((ulong)uStack_320 >> 0x20);
  local_68 = in_XMM0_Da * local_1a8 + local_68;
  fStack_64 = in_XMM0_Da * fStack_1a4 + fStack_64;
  fStack_60 = in_XMM0_Da * fStack_1a0 + fStack_60;
  fStack_5c = in_XMM0_Da * fStack_19c + fStack_5c;
  local_18 = (float)*in_RDI;
  fStack_14 = (float)((ulong)*in_RDI >> 0x20);
  fStack_10 = (float)in_RDI[1];
  fStack_c = (float)((ulong)in_RDI[1] >> 0x20);
  *in_RDI = CONCAT44(fStack_14 + fStack_64,local_18 + local_68);
  in_RDI[1] = CONCAT44(fStack_c + fStack_5c,fStack_10 + fStack_60);
  uVar1 = in_RDI[2];
  local_38 = (float)uVar1;
  fStack_34 = (float)((ulong)uVar1 >> 0x20);
  fStack_30 = (float)in_RDI[3];
  fStack_2c = (float)((ulong)in_RDI[3] >> 0x20);
  in_RDI[2] = CONCAT44(fStack_34 + fStack_64,local_38 + local_68);
  in_RDI[3] = CONCAT44(fStack_2c + fStack_5c,fStack_30 + fStack_60);
  return;
}

Assistant:

void move (float dx, float dy, float dz)
    {
      AffineSpace3fa xfm = camera2world();
      Vec3fa ds = xfmVector(xfm,Vec3fa(dx,dy,dz));
      from += ds;
      to   += ds;
    }